

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O3

wchar_t match_owner_name_mbs(archive_match *a,match_list *list,char *name)

{
  wchar_t wVar1;
  int iVar2;
  int *piVar3;
  match *pmVar4;
  char *p;
  char *local_30;
  
  if (((name != (char *)0x0) && (*name != '\0')) && (pmVar4 = list->first, pmVar4 != (match *)0x0))
  {
    do {
      wVar1 = archive_mstring_get_mbs(&a->archive,&pmVar4->pattern,&local_30);
      if ((wVar1 < L'\0') && (piVar3 = __errno_location(), *piVar3 == 0xc)) {
        archive_set_error(&a->archive,0xc,"No memory");
        (a->archive).state = 0x8000;
        return L'\xffffffe2';
      }
      if ((local_30 != (char *)0x0) && (iVar2 = strcmp(local_30,name), iVar2 == 0)) {
        pmVar4->matches = pmVar4->matches + 1;
        return L'\x01';
      }
      pmVar4 = pmVar4->next;
    } while (pmVar4 != (match *)0x0);
  }
  return L'\0';
}

Assistant:

static int
match_owner_name_mbs(struct archive_match *a, struct match_list *list,
    const char *name)
{
	struct match *m;
	const char *p;

	if (name == NULL || *name == '\0')
		return (0);
	for (m = list->first; m; m = m->next) {
		if (archive_mstring_get_mbs(&(a->archive), &(m->pattern), &p)
		    < 0 && errno == ENOMEM)
			return (error_nomem(a));
		if (p != NULL && strcmp(p, name) == 0) {
			m->matches++;
			return (1);
		}
	}
	return (0);
}